

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light.cpp
# Opt level: O0

Light_EvalRes * embree::Light_eval(Light *uniform,DifferentialGeometry *param_2,Vec3fa *param_3)

{
  Light_EvalRes *in_RDI;
  float fVar1;
  Light_EvalRes *res;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined4 local_3c;
  undefined8 *local_38;
  undefined8 *local_30;
  undefined1 *local_20;
  undefined4 local_18;
  undefined4 uStack_14;
  undefined4 uStack_10;
  undefined4 uStack_c;
  undefined4 uStack_8;
  
  Light_EvalRes::Light_EvalRes(in_RDI);
  local_38 = &local_78;
  local_3c = 0;
  uStack_8 = 0;
  local_18 = 0;
  uStack_14 = 0;
  uStack_10 = 0;
  uStack_c = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_30 = &local_78;
  *(undefined8 *)&(in_RDI->value).field_0 = 0;
  *(undefined8 *)((long)&(in_RDI->value).field_0 + 8) = 0;
  local_20 = &inf;
  fVar1 = std::numeric_limits<float>::infinity();
  in_RDI->dist = fVar1;
  in_RDI->pdf = 0.0;
  return in_RDI;
}

Assistant:

SYCL_EXTERNAL Light_EvalRes Light_eval(const Light* uniform,
                                                      const DifferentialGeometry&,
                                                      const Vec3fa&)
{
  Light_EvalRes res;
  res.value = Vec3fa(0.f);
  res.dist = inf;
  res.pdf = 0.f;
  return res;
}